

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,2ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_2UL>_>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  bool bVar1;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_2UL>_>
  *this_00;
  difference_type dVar2;
  scalar_type *psVar3;
  node_type *pnVar4;
  undefined4 uVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  undefined8 in_R8;
  splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
  *unaff_retaddr;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_00000008;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_00000010;
  size_type *in_stack_00000020;
  scalar_type *in_stack_00000028;
  box_type right;
  scalar_type split_val;
  size_type split_dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> split;
  node_type *node;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  undefined1 *i;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_2UL>_>
  *in_stack_ffffffffffffff20;
  box<float,_2UL> *this_01;
  int in_stack_ffffffffffffff28;
  scalar_type sVar6;
  int in_stack_ffffffffffffff2c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined1 local_74 [36];
  int *local_50;
  int *local_48;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_2UL>_>
  *pbVar7;
  index_type depth_00;
  undefined4 in_stack_ffffffffffffffe0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  value_type vVar9;
  
  depth_00 = (index_type)((ulong)in_R8 >> 0x20);
  vVar9 = (value_type)((ulong)in_RDX >> 0x20);
  _Var8._M_current = in_RDI._M_current;
  this_00 = (build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_2UL>_>
             *)chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>::
               allocate((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>
                         *)in_stack_ffffffffffffff20);
  end_00._M_current._4_4_ = in_stack_ffffffffffffff2c;
  end_00._M_current._0_4_ = in_stack_ffffffffffffff28;
  bVar1 = is_leaf<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_ffffffffffffff20,
                     (index_type)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     in_stack_ffffffffffffff30,end_00);
  if (bVar1) {
    pbVar7 = this_00;
    local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
    dVar2 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff20,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff18);
    uVar5 = (undefined4)dVar2;
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
    __gnu_cxx::operator-
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff20,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff18);
    kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>::set_leaf<int>
              ((kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_> *)
               this_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    _Var8._M_current._4_4_ = uVar5;
    _Var8._M_current._0_4_ = in_stack_ffffffffffffff38;
    compute_bounding_box<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (this_00,in_RDI,_Var8,
               (box_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  else {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)(local_74 + 0xc)
              );
    i = local_74 + 4;
    this_01 = (box<float,_2UL> *)local_74;
    splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
    ::operator()(unaff_retaddr,vVar9,in_stack_00000010,in_stack_00000008,
                 (box_type *)in_RCX._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 _Var8._M_current,in_stack_00000020,in_stack_00000028);
    sVar6 = (scalar_type)local_74._0_4_;
    psVar3 = box<float,_2UL>::max(this_01,(size_type)i);
    *psVar3 = sVar6;
    psVar3 = box<float,_2UL>::min(this_01,(size_type)i);
    *psVar3 = (scalar_type)local_74._0_4_;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_2UL>_>
                         *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),depth_00,in_RCX,_Var8,
                        (box_type *)this_00);
    ((kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_> *)&this_00->space_
    )->left = pnVar4;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_2UL>_>
                         *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),depth_00,in_RCX,_Var8,
                        (box_type *)this_00);
    *(node_type **)&this_00->stop_value_ = pnVar4;
    kd_tree_node_euclidean<int,float>::set_branch<pico_tree::internal::box<float,2ul>>
              ((kd_tree_node_euclidean<int,_float> *)in_stack_ffffffffffffff30._M_current,
               (box<float,_2UL> *)CONCAT44(local_74._0_4_,sVar6),this_01,(size_t)i);
    box_base<pico_tree::internal::box<float,2ul>>::fit<pico_tree::internal::box<float,2ul>>
              ((box_base<pico_tree::internal::box<float,_2UL>_> *)in_RDI._M_current,
               (box_base<pico_tree::internal::box<float,_2UL>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pbVar7 = this_00;
  }
  return (node_type *)pbVar7;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }